

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void readrle(BinarySource *bs,termline *ldata,
            _func_void_BinarySource_ptr_termchar_ptr_termline_ptr_unsigned_long_ptr *readliteral)

{
  wchar_t wVar1;
  _Bool _Var2;
  undefined3 uVar3;
  byte bVar4;
  uint uVar5;
  int local_4c;
  long lStack_48;
  wchar_t count_1;
  size_t count;
  size_t pos;
  unsigned_long uStack_30;
  wchar_t hdr;
  unsigned_long state;
  _func_void_BinarySource_ptr_termchar_ptr_termline_ptr_unsigned_long_ptr *p_Stack_20;
  wchar_t n;
  _func_void_BinarySource_ptr_termchar_ptr_termline_ptr_unsigned_long_ptr *readliteral_local;
  termline *ldata_local;
  BinarySource *bs_local;
  
  state._4_4_ = 0;
  uStack_30 = 0;
  p_Stack_20 = readliteral;
  readliteral_local =
       (_func_void_BinarySource_ptr_termchar_ptr_termline_ptr_unsigned_long_ptr *)ldata;
  ldata_local = (termline *)bs;
  do {
    while( true ) {
      if (*(int *)(readliteral_local + 4) <= state._4_4_) {
        if (state._4_4_ != *(int *)(readliteral_local + 4)) {
          __assert_fail("n == ldata->cols",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                        ,0x337,
                        "void readrle(BinarySource *, termline *, void (*)(BinarySource *, termchar *, termline *, unsigned long *))"
                       );
        }
        return;
      }
      bVar4 = BinarySource_get_byte(*(BinarySource **)&ldata_local->trusted);
      uVar5 = (uint)bVar4;
      if (0x7f < uVar5) break;
      local_4c = uVar5 + 1;
      while (local_4c != 0) {
        if (*(int *)(readliteral_local + 4) <= state._4_4_) {
          __assert_fail("n < ldata->cols",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                        ,0x330,
                        "void readrle(BinarySource *, termline *, void (*)(BinarySource *, termchar *, termline *, unsigned long *))"
                       );
        }
        (*p_Stack_20)((BinarySource *)ldata_local,
                      (termchar *)(*(long *)(readliteral_local + 0x18) + (long)state._4_4_ * 0x20),
                      (termline *)readliteral_local,&stack0xffffffffffffffd0);
        state._4_4_ = state._4_4_ + 1;
        local_4c = local_4c + -1;
      }
    }
    wVar1 = ldata_local->size;
    _Var2 = ldata_local->temporary;
    uVar3 = *(undefined3 *)&ldata_local->field_0xd;
    lStack_48 = (long)(int)(uVar5 - 0x7e);
    while (lStack_48 != 0) {
      if (*(int *)(readliteral_local + 4) <= state._4_4_) {
        __assert_fail("n < ldata->cols",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                      ,0x326,
                      "void readrle(BinarySource *, termline *, void (*)(BinarySource *, termchar *, termline *, unsigned long *))"
                     );
      }
      ldata_local->size = wVar1;
      ldata_local->temporary = _Var2;
      *(undefined3 *)&ldata_local->field_0xd = uVar3;
      (*p_Stack_20)((BinarySource *)ldata_local,
                    (termchar *)(*(long *)(readliteral_local + 0x18) + (long)state._4_4_ * 0x20),
                    (termline *)readliteral_local,&stack0xffffffffffffffd0);
      state._4_4_ = state._4_4_ + 1;
      lStack_48 = lStack_48 + -1;
    }
  } while( true );
}

Assistant:

static void readrle(BinarySource *bs, termline *ldata,
                    void (*readliteral)(BinarySource *bs, termchar *c,
                                        termline *ldata, unsigned long *state))
{
    int n = 0;
    unsigned long state = 0;

    while (n < ldata->cols) {
        int hdr = get_byte(bs);

        if (hdr >= 0x80) {
            /* A run. */

            size_t pos = bs->pos, count = hdr + 2 - 0x80;
            while (count--) {
                assert(n < ldata->cols);
                bs->pos = pos;
                readliteral(bs, ldata->chars + n, ldata, &state);
                n++;
            }
        } else {
            /* Just a sequence of consecutive literals. */

            int count = hdr + 1;
            while (count--) {
                assert(n < ldata->cols);
                readliteral(bs, ldata->chars + n, ldata, &state);
                n++;
            }
        }
    }

    assert(n == ldata->cols);
}